

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.h
# Opt level: O1

bool __thiscall TTD::FileReader::ReadRawChar(FileReader *this,char16 *c)

{
  size_t sVar1;
  
  if (this->m_peekChar == -1) {
    if (this->m_cursor == this->m_buffCount) {
      ReadBlock(this,this->m_buffer,&this->m_buffCount);
      this->m_cursor = 0;
    }
    sVar1 = this->m_cursor;
    if (sVar1 == this->m_buffCount) {
      *c = L'\0';
      return false;
    }
    *c = *(char16 *)(this->m_buffer + sVar1);
    this->m_cursor = sVar1 + 2;
  }
  else {
    *c = (char16)this->m_peekChar;
    this->m_peekChar = -1;
  }
  return true;
}

Assistant:

bool ReadRawChar(_Out_ char16* c)
        {
            if(this->m_peekChar != -1)
            {
                *c = (char16)this->m_peekChar;
                this->m_peekChar = -1;

                return true;
            }
            else
            {
                if(this->m_cursor == this->m_buffCount)
                {
                    this->ReadBlock(this->m_buffer, &this->m_buffCount);
                    this->m_cursor = 0;
                }

                if(this->m_cursor == this->m_buffCount)
                {
                    // Make sure to set a value before we return.
                    *c = _u('\0');

                    return false;
                }
                else
                {
                    *c = *((char16*)(this->m_buffer + this->m_cursor));
                    this->m_cursor += sizeof(char16);

                    return true;
                }
            }
        }